

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int run_suite(pcut_item_t *suite,pcut_item_t **last,char *prog_path)

{
  bool bVar1;
  int iVar2;
  pcut_item_t *test;
  int iVar3;
  int iVar4;
  
  test = pcut_get_real_next(suite);
  iVar4 = 0;
  if (test == (pcut_item_t *)0x0) {
    test = (pcut_item_t *)0x0;
  }
  else {
    iVar4 = 0;
    if (test->kind != 4) {
      iVar4 = 0;
      iVar3 = 0;
      bVar1 = true;
      do {
        if (test->kind == 5) {
          if (bVar1) {
            pcut_report_suite_start(suite);
          }
          if (pcut_run_mode == 1) {
            iVar2 = pcut_run_test_forking(prog_path,test);
          }
          else {
            iVar2 = pcut_run_test_single(test);
          }
          if (iVar2 != 0) {
            iVar4 = 1;
          }
          iVar3 = iVar3 + 1;
          bVar1 = false;
        }
        else if (test->kind == 4) break;
        test = pcut_get_real_next(test);
      } while (test != (pcut_item_t *)0x0);
      if (0 < iVar3) {
        pcut_report_suite_done(suite);
      }
    }
  }
  if (last != (pcut_item_t **)0x0) {
    *last = test;
  }
  return iVar4;
}

Assistant:

static int run_suite(pcut_item_t *suite, pcut_item_t **last, const char *prog_path) {
	int is_first_test = 1;
	int total_count = 0;
	int ret_code = PCUT_OUTCOME_PASS;
	int ret_code_tmp;

	pcut_item_t *it = pcut_get_real_next(suite);
	if ((it == NULL) || (it->kind == PCUT_KIND_TESTSUITE)) {
		goto leave_no_print;
	}

	for (; it != NULL; it = pcut_get_real_next(it)) {
		if (it->kind == PCUT_KIND_TESTSUITE) {
			goto leave_ok;
		}
		if (it->kind != PCUT_KIND_TEST) {
			continue;
		}

		if (is_first_test) {
			pcut_report_suite_start(suite);
			is_first_test = 0;
		}

		if (pcut_run_mode == PCUT_RUN_MODE_FORKING) {
			ret_code_tmp = pcut_run_test_forking(prog_path, it);
		} else {
			ret_code_tmp = pcut_run_test_single(it);
		}

		/*
		 * Override final return code in case of failure.
		 *
		 * In this case we suppress any special error codes as
		 * to the outside, there was a failure.
		 */
		if (ret_code_tmp != PCUT_OUTCOME_PASS) {
			ret_code = PCUT_OUTCOME_FAIL;
		}

		total_count++;
	}

leave_ok:
	if (total_count > 0) {
		pcut_report_suite_done(suite);
	}

leave_no_print:
	if (last != NULL) {
		*last = it;
	}

	return ret_code;
}